

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

void uv__udp_finish_close(uv_udp_t *handle)

{
  uv__queue *puVar1;
  uv__queue *puVar2;
  uint __line;
  int iVar3;
  char *__assertion;
  
  iVar3 = uv__io_active(&handle->io_watcher,5);
  if (iVar3 == 0) {
    if ((handle->io_watcher).fd == -1) {
      while (puVar1 = (handle->write_queue).next, puVar1 != &handle->write_queue) {
        puVar2 = puVar1->next;
        puVar1->prev->next = puVar2;
        puVar2->prev = puVar1->prev;
        puVar1[10].next = (uv__queue *)0xffffffffffffff83;
        puVar1->next = &handle->write_completed_queue;
        puVar2 = (handle->write_completed_queue).prev;
        puVar1->prev = puVar2;
        puVar2->next = puVar1;
        (handle->write_completed_queue).prev = puVar1;
      }
      uv__udp_run_completed(handle);
      if (handle->send_queue_size == 0) {
        if (handle->send_queue_count == 0) {
          handle->alloc_cb = (uv_alloc_cb)0x0;
          handle->recv_cb = (uv_udp_recv_cb)0x0;
          return;
        }
        __assertion = "handle->send_queue_count == 0";
        __line = 0x52;
      }
      else {
        __assertion = "handle->send_queue_size == 0";
        __line = 0x51;
      }
    }
    else {
      __assertion = "handle->io_watcher.fd == -1";
      __line = 0x44;
    }
  }
  else {
    __assertion = "!uv__io_active(&handle->io_watcher, POLLIN | POLLOUT)";
    __line = 0x43;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                ,__line,"void uv__udp_finish_close(uv_udp_t *)");
}

Assistant:

void uv__udp_finish_close(uv_udp_t* handle) {
  uv_udp_send_t* req;
  struct uv__queue* q;

  assert(!uv__io_active(&handle->io_watcher, POLLIN | POLLOUT));
  assert(handle->io_watcher.fd == -1);

  while (!uv__queue_empty(&handle->write_queue)) {
    q = uv__queue_head(&handle->write_queue);
    uv__queue_remove(q);

    req = uv__queue_data(q, uv_udp_send_t, queue);
    req->status = UV_ECANCELED;
    uv__queue_insert_tail(&handle->write_completed_queue, &req->queue);
  }

  uv__udp_run_completed(handle);

  assert(handle->send_queue_size == 0);
  assert(handle->send_queue_count == 0);

  /* Now tear down the handle. */
  handle->recv_cb = NULL;
  handle->alloc_cb = NULL;
  /* but _do not_ touch close_cb */
}